

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_meth.c
# Opt level: O0

int ecx_set_pub_key(EVP_PKEY *pkey,uchar *pub,size_t len)

{
  OSSL_PROVIDER *prov;
  ECX_KEY *key;
  EVP_PKEY *in_RDI;
  ECX_KEY *ecx;
  OSSL_LIB_CTX *libctx;
  ecx_key_op_t in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  uchar *in_stack_00000040;
  X509_ALGOR *in_stack_00000048;
  char *in_stack_00000060;
  uint local_4;
  
  if (*(long *)&in_RDI[1].save_parameters != 0) {
    prov = EVP_KEYMGMT_get0_provider(*(EVP_KEYMGMT **)&in_RDI[1].save_parameters);
    ossl_provider_libctx(prov);
  }
  key = ossl_ecx_key_op(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038,
                        in_stack_00000034,(OSSL_LIB_CTX *)pkey,in_stack_00000060);
  if (key != (ECX_KEY *)0x0) {
    EVP_PKEY_assign(in_RDI,**(int **)&in_RDI->references,key);
  }
  local_4 = (uint)(key != (ECX_KEY *)0x0);
  return local_4;
}

Assistant:

static int ecx_set_pub_key(EVP_PKEY *pkey, const unsigned char *pub, size_t len)
{
    OSSL_LIB_CTX *libctx = NULL;
    ECX_KEY *ecx = NULL;

    if (pkey->keymgmt != NULL)
        libctx = ossl_provider_libctx(EVP_KEYMGMT_get0_provider(pkey->keymgmt));

    ecx = ossl_ecx_key_op(NULL, pub, len, pkey->ameth->pkey_id,
                          KEY_OP_PUBLIC, libctx, NULL);

    if (ecx != NULL) {
        EVP_PKEY_assign(pkey, pkey->ameth->pkey_id, ecx);
        return 1;
    }
    return 0;
}